

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

bool __thiscall TCLAP::Arg::operator==(Arg *this,Arg *a)

{
  bool bVar1;
  __type _Var2;
  Arg *a_local;
  Arg *this_local;
  
  bVar1 = std::operator!=(&this->_flag,"");
  if (((bVar1) && (_Var2 = std::operator==(&this->_flag,&a->_flag), _Var2)) ||
     (_Var2 = std::operator==(&this->_name,&a->_name), _Var2)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool Arg::operator==(const Arg& a) const
{
	if ( ( _flag != "" && _flag == a._flag ) || _name == a._name)
		return true;
	else
		return false;
}